

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O3

void beagle_library_finalize(void)

{
  _List_node_base *p_Var1;
  pointer ppBVar2;
  _List_node_base *p_Var3;
  vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *pvVar4;
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *plVar5;
  list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *plVar6;
  
  plVar6 = plugins_abi_cxx11_;
  if (loaded != 0 &&
      plugins_abi_cxx11_ !=
      (list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)0x0) {
    p_Var3 = (plugins_abi_cxx11_->
             super__List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)plVar6) {
      p_Var1 = (((_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)
                &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var3);
      p_Var3 = p_Var1;
    }
    operator_delete(plVar6);
  }
  plVar5 = implFactory_abi_cxx11_;
  if (loaded != 0 &&
      implFactory_abi_cxx11_ !=
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    p_Var3 = (implFactory_abi_cxx11_->
             super__List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)plVar5) {
      p_Var1 = (((_List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var3);
      p_Var3 = p_Var1;
    }
    operator_delete(plVar5);
  }
  if (loaded != 0 && rsrcList != (BeagleResourceList *)0x0) {
    free(rsrcList->list);
    free(rsrcList);
  }
  if ((rsrcBenchList != (BeagleBenchmarkedResourceList *)0x0) && (loaded != 0)) {
    free(rsrcBenchList->list);
    free(rsrcBenchList);
  }
  pvVar4 = instances;
  if ((instances != (vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *)0x0) &&
     (loaded != 0)) {
    ppBVar2 = (instances->
              super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar2 != (pointer)0x0) {
      operator_delete(ppBVar2);
    }
    operator_delete(pvVar4);
  }
  loaded = 0;
  return;
}

Assistant:

void beagle_library_finalize(void) {
  DEBUG_FINALIZE_TIME();
    // FIXME: need to destroy each plugin
    // the following code segfaults
/*  std::list<beagle::plugin::Plugin*>::iterator plugin_iter = plugins.begin();
    for(; plugin_iter != plugins.end(); plugin_iter++ ){
        delete *plugin_iter;
    }
    plugins.clear();
*/

    if(plugins!=NULL && loaded){
        delete plugins;
    }
    // Destroy implFactory.
    // The contained factory pointers will be deleted by the plugins themselves
    if (implFactory && loaded) {
        try {
        delete implFactory;
        } catch (...) {

        }
    }

    // Destroy rsrcList
    // The resources will be deleted by the plugins themselves
    if (rsrcList && loaded) {
        free(rsrcList->list);
        free(rsrcList);
    }

    if (rsrcBenchList && loaded) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
    }


    // Destroy instances
    if (instances && loaded) {
        delete instances;
    }
    loaded = 0;
}